

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogl_shader.c
# Opt level: O3

GLuint al_get_opengl_program_object(ALLEGRO_SHADER *shader)

{
  GLuint GVar1;
  
  GVar1 = 0;
  if (shader->platform == ALLEGRO_SHADER_GLSL) {
    GVar1 = *(GLuint *)&shader[1].pixel_copy;
  }
  return GVar1;
}

Assistant:

GLuint al_get_opengl_program_object(ALLEGRO_SHADER *shader)
{
   ASSERT(shader);
#ifdef ALLEGRO_CFG_SHADER_GLSL
   if (shader->platform != ALLEGRO_SHADER_GLSL)
      return 0;

   return ((ALLEGRO_SHADER_GLSL_S *)shader)->program_object;
#else
   return 0;
#endif
}